

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketResource.cpp
# Opt level: O0

bool __thiscall SocketResource::setBlockMode(SocketResource *this)

{
  uint uVar1;
  int iVar2;
  bool ret;
  int flags;
  SocketResource *this_local;
  
  uVar1 = fcntl(this->m_socket,3,0);
  iVar2 = fcntl(this->m_socket,4,(ulong)(uVar1 & 0xfffff7ff));
  return iVar2 == 0;
}

Assistant:

bool SocketResource::setBlockMode()
{
#ifdef _WIN32
    u_long iMode = 0;
    const bool ret = N0_ERROR == ioctlsocket(m_socket, FIONBIO, &iMode);
#else
    const int flags = fcntl(m_socket, F_GETFL, 0);
    const bool ret = NO_ERROR == fcntl(m_socket, F_SETFL, flags & ~O_NONBLOCK);
#endif

    return ret;
}